

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O2

void __thiscall matrix_sparse_row_test_at_Test::TestBody(matrix_sparse_row_test_at_Test *this)

{
  pointer piVar1;
  long *plVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  const_reference_value pdVar6;
  char *pcVar7;
  long lVar8;
  pointer *__ptr;
  long *plVar9;
  DeathTest *gtest_dt;
  ReturnSentinel gtest_sentinel;
  AssertionResult gtest_ar;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_90;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  Matrix_Sparse_Row<double,_int> row;
  
  row.ptr_data = &(this->super_matrix_sparse_row_test).csr_data;
  piVar1 = (this->super_matrix_sparse_row_test).csr_data.row_offset.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  row.iter_row_offset._M_current = piVar1 + 2;
  lVar8 = (long)piVar1[2];
  row.i_column._M_ptr =
       (this->super_matrix_sparse_row_test).csr_data.i_column.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
       lVar8;
  row.i_column._M_extent._M_extent_value = piVar1[3] - lVar8;
  row.value._M_ptr =
       (this->super_matrix_sparse_row_test).csr_data.value.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       + lVar8;
  gtest_dt._0_4_ = 1;
  row.value._M_extent._M_extent_value = row.i_column._M_extent._M_extent_value;
  pdVar6 = Disa::Matrix_Sparse_Row<double,_int>::at(&row,(index_type *)&gtest_dt);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"row.at(1)","3.0",*pdVar6,3.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_dt);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfa,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_dt._0_4_ = 3;
  pdVar6 = Disa::Matrix_Sparse_Row<double,_int>::at(&row,(index_type *)&gtest_dt);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"row.at(3)","4.0",*pdVar6,4.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_dt);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfb,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_dt._0_4_ = 4;
  pdVar6 = Disa::Matrix_Sparse_Row<double,_int>::at(&row,(index_type *)&gtest_dt);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"row.at(4)","5.0",*pdVar6,5.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_dt);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfc,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_dt)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("remove_warning = row.at(0)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0xff,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    if (!bVar3) goto LAB_0010e438;
    plVar9 = (long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_);
    if (plVar9 != (long *)0x0) {
      iVar5 = (**(code **)(*plVar9 + 0x10))(plVar9);
      if (iVar5 == 0) {
        plVar2 = (long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_);
        iVar5 = (**(code **)(*plVar2 + 0x18))(plVar2);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(*plVar2 + 0x20))(plVar2,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(*plVar9 + 8))(plVar9);
          goto LAB_0010e438;
        }
      }
      else if (iVar5 == 1) {
        gtest_sentinel.test_ = (DeathTest *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_);
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          gtest_ar.success_ = false;
          gtest_ar._1_3_ = 0;
          Disa::Matrix_Sparse_Row<double,_int>::at(&row,(index_type *)&gtest_ar);
        }
        (**(code **)(*(long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_) + 0x28))
                  ((long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_),2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      lVar8 = *plVar9;
      goto LAB_0010e483;
    }
  }
  else {
LAB_0010e438:
    testing::Message::Message((Message *)&gtest_ar);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xff,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    plVar9 = (long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_);
    if (plVar9 != (long *)0x0) {
      lVar8 = *plVar9;
LAB_0010e483:
      (**(code **)(lVar8 + 8))(plVar9);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("remove_warning = row.at(2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_90,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0x100,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_90);
    if (!bVar3) goto LAB_0010e56d;
    plVar9 = (long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_);
    if (plVar9 != (long *)0x0) {
      iVar5 = (**(code **)(*plVar9 + 0x10))(plVar9);
      if (iVar5 == 0) {
        plVar2 = (long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_);
        iVar5 = (**(code **)(*plVar2 + 0x18))(plVar2);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(*plVar2 + 0x20))(plVar2,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(*plVar9 + 8))(plVar9);
          goto LAB_0010e56d;
        }
      }
      else if (iVar5 == 1) {
        gtest_sentinel.test_ = (DeathTest *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_);
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          gtest_ar.success_ = true;
          gtest_ar._1_3_ = 0;
          Disa::Matrix_Sparse_Row<double,_int>::at(&row,(index_type *)&gtest_ar);
        }
        (**(code **)(*(long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_) + 0x28))
                  ((long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_),2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      lVar8 = *plVar9;
      goto LAB_0010e5b8;
    }
  }
  else {
LAB_0010e56d:
    testing::Message::Message((Message *)&gtest_ar);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x100,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    plVar9 = (long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_);
    if (plVar9 != (long *)0x0) {
      lVar8 = *plVar9;
LAB_0010e5b8:
      (**(code **)(lVar8 + 8))(plVar9);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("remove_warning = row.at(5)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0x101,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a8);
    if (bVar3) {
      plVar9 = (long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_);
      if (plVar9 == (long *)0x0) {
        return;
      }
      iVar5 = (**(code **)(*plVar9 + 0x10))(plVar9);
      if (iVar5 == 0) {
        plVar2 = (long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_);
        iVar5 = (**(code **)(*plVar2 + 0x18))(plVar2);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(*plVar2 + 0x20))(plVar2,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(*plVar9 + 8))(plVar9);
          goto LAB_0010e6a2;
        }
      }
      else if (iVar5 == 1) {
        gtest_sentinel.test_ = (DeathTest *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_);
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          gtest_ar.success_ = true;
          gtest_ar._1_3_ = 0;
          Disa::Matrix_Sparse_Row<double,_int>::at(&row,(index_type *)&gtest_ar);
        }
        (**(code **)(*(long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_) + 0x28))
                  ((long *)CONCAT44(gtest_dt._4_4_,gtest_dt._0_4_),2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      lVar8 = *plVar9;
      goto LAB_0010e6ed;
    }
  }
LAB_0010e6a2:
  testing::Message::Message((Message *)&gtest_ar);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_dt,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
             ,0x101,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
  plVar9 = (long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_);
  if (plVar9 == (long *)0x0) {
    return;
  }
  lVar8 = *plVar9;
LAB_0010e6ed:
  (**(code **)(lVar8 + 8))(plVar9);
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, at) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);

  EXPECT_DOUBLE_EQ(row.at(1), 3.0);
  EXPECT_DOUBLE_EQ(row.at(3), 4.0);
  EXPECT_DOUBLE_EQ(row.at(4), 5.0);

  double remove_warning = 0;
  EXPECT_DEATH(remove_warning = row.at(0), "./*");
  EXPECT_DEATH(remove_warning = row.at(2), "./*");
  EXPECT_DEATH(remove_warning = row.at(5), "./*");
}